

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneExtensionRange
          (MessageGenerator *this,Printer *p,int start,int end)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  Sub *local_268;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined1 local_222;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1e9;
  string local_1e8;
  Sub *local_1c8;
  Sub local_1c0;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  int end_local;
  int start_local;
  Printer *p_local;
  MessageGenerator *this_local;
  
  v.storage_.callback_buffer_._0_4_ = end;
  v.storage_.callback_buffer_._4_4_ = start;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)local_30,p,&this->variables_);
  local_222 = 1;
  local_1c8 = &local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"start",&local_1e9);
  io::Printer::Sub::Sub<int&>(&local_1c0,&local_1e8,(int *)(v.storage_.callback_buffer_ + 4));
  local_1c8 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"end",&local_221);
  io::Printer::Sub::Sub<int&>(&local_108,&local_220,(int *)v.storage_.callback_buffer_);
  local_222 = 0;
  local_50 = &local_1c0;
  local_48 = 2;
  v_00._M_len = 2;
  v_00._M_array = local_50;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,
             "\n        // Extension range [$start$, $end$)\n        target = this_.$extensions$._InternalSerialize(\n            &default_instance(), $start$, $end$, target, stream);\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(p,local_40._M_allocated_capacity,local_40._8_8_,local_238._M_len,
                    local_238._M_str);
  local_268 = (Sub *)&local_50;
  do {
    local_268 = local_268 + -1;
    io::Printer::Sub::~Sub(local_268);
  } while (local_268 != &local_1c0);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)local_30);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneExtensionRange(io::Printer* p,
                                                          int start, int end) {
  auto v = p->WithVars(variables_);
  p->Emit(  //
      {{"start", start}, {"end", end}},
      R"cc(
        // Extension range [$start$, $end$)
        target = this_.$extensions$._InternalSerialize(
            &default_instance(), $start$, $end$, target, stream);
      )cc");
}